

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReportWarning(ColladaParser *this,char *msg,...)

{
  char in_AL;
  Logger *this_00;
  ulong uVar1;
  basic_formatter *this_01;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e88 [16];
  undefined8 local_e78;
  undefined8 local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 local_e48;
  undefined8 local_e38;
  undefined8 local_e28;
  undefined8 local_e18;
  undefined8 local_e08;
  undefined8 local_df8;
  undefined8 local_de8;
  allocator local_db9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_d98;
  string local_c20;
  int local_bfc;
  char local_bf8 [4];
  int iLen;
  char szBuffer [3000];
  undefined4 local_38;
  undefined4 local_34;
  va_list args;
  char *msg_local;
  ColladaParser *this_local;
  
  if (in_AL != '\0') {
    local_e58 = in_XMM0_Qa;
    local_e48 = in_XMM1_Qa;
    local_e38 = in_XMM2_Qa;
    local_e28 = in_XMM3_Qa;
    local_e18 = in_XMM4_Qa;
    local_e08 = in_XMM5_Qa;
    local_df8 = in_XMM6_Qa;
    local_de8 = in_XMM7_Qa;
  }
  local_e78 = in_RDX;
  local_e70 = in_RCX;
  local_e68 = in_R8;
  local_e60 = in_R9;
  if (msg != (char *)0x0) {
    args[0].overflow_arg_area = local_e88;
    args[0]._0_8_ = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    local_bfc = vsprintf(local_bf8,msg,&local_38);
    if (0 < local_bfc) {
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[21]>(&local_d98,(char (*) [21])"Validation warning: ");
      uVar1 = (ulong)local_bfc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_db8,local_bf8,uVar1,&local_db9);
      this_01 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_d98,&local_db8);
      Formatter::basic_formatter::operator_cast_to_string(&local_c20,this_01);
      Logger::warn(this_00,&local_c20);
      std::__cxx11::string::~string((string *)&local_c20);
      std::__cxx11::string::~string((string *)&local_db8);
      std::allocator<char>::~allocator((allocator<char> *)&local_db9);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_d98);
      return;
    }
    __assert_fail("iLen > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.cpp"
                  ,0xc72,"void Assimp::ColladaParser::ReportWarning(const char *, ...)");
  }
  __assert_fail("__null != msg",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.cpp"
                ,0xc6b,"void Assimp::ColladaParser::ReportWarning(const char *, ...)");
}

Assistant:

void ColladaParser::ReportWarning(const char* msg, ...)
{
    ai_assert(NULL != msg);

    va_list args;
    va_start(args, msg);

    char szBuffer[3000];
    const int iLen = vsprintf(szBuffer, msg, args);
    ai_assert(iLen > 0);

    va_end(args);
    ASSIMP_LOG_WARN_F("Validation warning: ", std::string(szBuffer, iLen));
}